

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O1

Result __thiscall
wabt::TypeChecker::CheckOpcode3
          (TypeChecker *this,Opcode opcode,Limits *limits1,Limits *limits2,Limits *limits3)

{
  bool bVar1;
  TypeChecker *this_00;
  Result RVar2;
  Type expected1;
  Type expected2;
  Type expected3;
  Opcode local_74;
  TypeChecker *local_70;
  Info local_68;
  
  bVar1 = (limits1 != (Limits *)0x0 || limits2 != (Limits *)0x0) || limits3 != (Limits *)0x0;
  local_74.enum_ = opcode.enum_;
  local_70 = this;
  Opcode::GetInfo(&local_68,&local_74);
  if ((limits1 == (Limits *)0x0) || (expected1.enum_ = I64, (limits1->is_64 & bVar1) == 0)) {
    expected1.enum_ = local_68.param_types[0].enum_;
  }
  Opcode::GetInfo(&local_68,&local_74);
  if ((limits2 == (Limits *)0x0) || (expected2.enum_ = I64, (limits2->is_64 & bVar1) == 0)) {
    expected2.enum_ = local_68.param_types[1].enum_;
  }
  Opcode::GetInfo(&local_68,&local_74);
  if ((limits3 == (Limits *)0x0) || (expected3.enum_ = I64, (limits3->is_64 & bVar1) == 0)) {
    expected3.enum_ = local_68.param_types[2].enum_;
  }
  Opcode::GetInfo(&local_68,&local_74);
  this_00 = local_70;
  RVar2 = PopAndCheck3Types(local_70,expected1,expected2,expected3,local_68.name);
  Opcode::GetInfo(&local_68,&local_74);
  PushType(this_00,local_68.result_type);
  return (Result)RVar2.enum_;
}

Assistant:

Result TypeChecker::CheckOpcode3(Opcode opcode,
                                 const Limits* limits1,
                                 const Limits* limits2,
                                 const Limits* limits3) {
  bool has_address_operands = limits1 || limits2 || limits3;
  Result result =
      PopAndCheck3Types(opcode.GetMemoryParam(opcode.GetParamType1(), limits1,
                                              has_address_operands),
                        opcode.GetMemoryParam(opcode.GetParamType2(), limits2,
                                              has_address_operands),
                        opcode.GetMemoryParam(opcode.GetParamType3(), limits3,
                                              has_address_operands),
                        opcode.GetName());
  PushType(opcode.GetResultType());
  return result;
}